

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

MemTxResult
memory_region_dispatch_read1
          (uc_struct_conflict15 *uc,MemoryRegion_conflict *mr,hwaddr addr,uint64_t *pval,uint size,
          MemTxAttrs attrs)

{
  uint size_local;
  uint64_t *pval_local;
  hwaddr addr_local;
  MemoryRegion_conflict *mr_local;
  uc_struct_conflict15 *uc_local;
  MemTxAttrs attrs_local;
  
  *pval = 0;
  if (mr->ops->read == (_func_uint64_t_uc_struct_ptr_void_ptr_hwaddr_uint_conflict15 *)0x0) {
    uc_local._4_4_ =
         access_with_adjusted_size
                   (uc,addr,pval,size,(mr->ops->impl).min_access_size,
                    (mr->ops->impl).max_access_size,memory_region_read_with_attrs_accessor,mr,attrs)
    ;
  }
  else {
    uc_local._4_4_ =
         access_with_adjusted_size
                   (uc,addr,pval,size,(mr->ops->impl).min_access_size,
                    (mr->ops->impl).max_access_size,memory_region_read_accessor,mr,attrs);
  }
  return uc_local._4_4_;
}

Assistant:

static MemTxResult memory_region_dispatch_read1(struct uc_struct *uc, MemoryRegion *mr,
                                                hwaddr addr,
                                                uint64_t *pval,
                                                unsigned size,
                                                MemTxAttrs attrs)
{
    *pval = 0;

    if (mr->ops->read) {
        return access_with_adjusted_size(uc, addr, pval, size,
                                         mr->ops->impl.min_access_size,
                                         mr->ops->impl.max_access_size,
                                         memory_region_read_accessor,
                                         mr, attrs);
    } else {
        return access_with_adjusted_size(uc, addr, pval, size,
                                         mr->ops->impl.min_access_size,
                                         mr->ops->impl.max_access_size,
                                         memory_region_read_with_attrs_accessor,
                                         mr, attrs);
    }
}